

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

int thread_pool_init(thread_pool_t *pool,size_t num_threads)

{
  int iVar1;
  Queue *pQVar2;
  pthread_t *ppVar3;
  size_t num_threads_local;
  thread_pool_t *pool_local;
  
  if (pool == (thread_pool_t *)0x0) {
    pool_local._4_4_ = -3;
  }
  else {
    pool->end = false;
    pool->size = 0;
    iVar1 = pthread_attr_init((pthread_attr_t *)&pool->attr);
    if (iVar1 < 0) {
      pool_local._4_4_ = -1;
    }
    else {
      iVar1 = sem_init((sem_t *)&pool->runnables_semaphore,0,0);
      if (iVar1 == 0) {
        iVar1 = sem_init((sem_t *)&pool->pool_mutex,0,1);
        if (iVar1 == 0) {
          pQVar2 = (Queue *)malloc(0x18);
          pool->runnables = pQVar2;
          if (pQVar2 == (Queue *)0x0) {
            pthread_attr_destroy((pthread_attr_t *)&pool->attr);
            sem_destroy((sem_t *)&pool->runnables_semaphore);
            sem_destroy((sem_t *)&pool->pool_mutex);
            pool_local._4_4_ = -2;
          }
          else {
            queueInit(pool->runnables);
            ppVar3 = (pthread_t *)malloc(num_threads << 3);
            pool->threads = ppVar3;
            if (ppVar3 == (pthread_t *)0x0) {
              pthread_attr_destroy((pthread_attr_t *)&pool->attr);
              sem_destroy((sem_t *)&pool->runnables_semaphore);
              sem_destroy((sem_t *)&pool->pool_mutex);
              free(pool->runnables);
              pool_local._4_4_ = -2;
            }
            else {
              while (pool->size != num_threads) {
                iVar1 = pthread_create(pool->threads + pool->size,(pthread_attr_t *)&pool->attr,
                                       thread_pool_thread,pool);
                if (iVar1 != 0) {
                  thread_pool_destroy(pool);
                  return -1;
                }
                pool->size = pool->size + 1;
              }
              pool_local._4_4_ = 0;
            }
          }
        }
        else {
          pthread_attr_destroy((pthread_attr_t *)&pool->attr);
          sem_destroy((sem_t *)&pool->runnables_semaphore);
          pool_local._4_4_ = -4;
        }
      }
      else {
        pthread_attr_destroy((pthread_attr_t *)&pool->attr);
        pool_local._4_4_ = -4;
      }
    }
  }
  return pool_local._4_4_;
}

Assistant:

int thread_pool_init(thread_pool_t *pool, size_t num_threads) {
    /* Checks if the pointer is valid. */
    if (!pool) {
        return invalid_argument_error;
    }

    /* Initializes the pool. */
    pool->end = false;
    pool->size = 0;

    /* Inits the attr. */
    if((pthread_attr_init(&(pool->attr))) < 0) {
        return pthread_error;
    }

    /* Initializes semaphores. */
    if((sem_init(&(pool->runnables_semaphore), THREAD_SEMAPHORE, 0))) {
        pthread_attr_destroy(&(pool->attr));
        return semaphore_error;
    }
    if((sem_init(&(pool->pool_mutex), THREAD_SEMAPHORE, 1))) {
        pthread_attr_destroy(&(pool->attr));
        sem_destroy(&(pool->runnables_semaphore));
        return semaphore_error;
    }

    /* Allocates memory and initializes the Queue. */
    if(!(pool->runnables = malloc(sizeof(Queue)))) {
        pthread_attr_destroy(&(pool->attr));
        sem_destroy(&(pool->runnables_semaphore));
        sem_destroy(&(pool->pool_mutex));
        return memory_error;
    }
    queueInit(pool->runnables);

    /* Allocates memory and start worker threads. */
    if(!(pool->threads = malloc(sizeof(pthread_t) * num_threads))) {
        pthread_attr_destroy(&(pool->attr));
        sem_destroy(&(pool->runnables_semaphore));
        sem_destroy(&(pool->pool_mutex));
        free(pool->runnables);
        return memory_error;
    }
    while(pool->size != num_threads) {
        if(pthread_create(&(pool->threads[pool->size]), &(pool->attr), thread_pool_thread, (void*)pool)) {
            thread_pool_destroy(pool);
            return pthread_error;
        }
        pool->size++;
    }

    return success;
}